

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DictionaryTypeHandlerBase<int>::SetPropertyValueInfo
          (DictionaryTypeHandlerBase<int> *this,PropertyValueInfo *info,RecyclableObject *instance,
          int propIndex,DictionaryPropertyDescriptor<int> *descriptor)

{
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = instance;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
    if ((descriptor->flags & (IsFixed|IsInitialized)) != IsInitialized) {
      *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
    }
  }
  if ((info != (PropertyValueInfo *)0x0) && ((descriptor->Attributes & 8) != 0)) {
    info->m_instance = instance;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyValueInfo(PropertyValueInfo* info, RecyclableObject* instance, T propIndex, DictionaryPropertyDescriptor<T>* descriptor)
    {
        SetPropertyValueInfoNonFixed(info, instance, propIndex, descriptor->Attributes);
        if (descriptor->IsOrMayBecomeFixed())
        {
            PropertyValueInfo::DisableStoreFieldCache(info);
        }
        if (descriptor->Attributes & PropertyDeleted)
        {
            // letconst shadowing a deleted property. don't bother to cache
            PropertyValueInfo::SetNoCache(info, instance);
        }
    }